

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O2

QIcon * SynthWidget::getSynthDetailsIcon(bool visible)

{
  int iVar1;
  QIcon *pQVar2;
  QArrayDataPointer<char16_t> QStack_28;
  
  if (getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE == '\0') {
    iVar1 = __cxa_guard_acquire(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE);
    if (iVar1 != 0) {
      QString::QString((QString *)&QStack_28,":/images/DetailsHide.gif");
      QIcon::QIcon((QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE,(QString *)&QStack_28)
      ;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
      __cxa_atexit(QIcon::~QIcon,&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE,&__dso_handle);
      __cxa_guard_release(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE);
    }
  }
  if (getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN == '\0') {
    iVar1 = __cxa_guard_acquire(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN);
    if (iVar1 != 0) {
      QString::QString((QString *)&QStack_28,":/images/Details.gif");
      QIcon::QIcon((QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN,(QString *)&QStack_28);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
      __cxa_atexit(QIcon::~QIcon,&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN,&__dso_handle);
      __cxa_guard_release(&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN);
    }
  }
  pQVar2 = (QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_HIDDEN;
  if (visible) {
    pQVar2 = (QIcon *)&getSynthDetailsIcon(bool)::SYNTH_DETAILS_VISIBLE;
  }
  return pQVar2;
}

Assistant:

const QIcon &SynthWidget::getSynthDetailsIcon(bool visible) {
	static const QIcon SYNTH_DETAILS_VISIBLE(":/images/DetailsHide.gif");
	static const QIcon SYNTH_DETAILS_HIDDEN(":/images/Details.gif");

	return visible ? SYNTH_DETAILS_VISIBLE : SYNTH_DETAILS_HIDDEN;
}